

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool SubtractionHelper<long,_int,_7>::Subtract(long *lhs,int *rhs,long *result)

{
  long lVar1;
  int64_t tmp;
  long *result_local;
  int *rhs_local;
  long *lhs_local;
  undefined1 local_1;
  
  lVar1 = *lhs - (long)*rhs;
  if ((((*lhs < 0) || (-1 < *rhs)) || (*lhs <= lVar1)) && ((*rhs < 0 || (lVar1 <= *lhs)))) {
    *result = lVar1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool Subtract( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is an std::int64_t, rhs signed (up to 64-bit)
        // we have essentially 4 cases:
        //
        // 1) lhs positive, rhs positive - overflow not possible
        // 2) lhs positive, rhs negative - equivalent to addition - result >= lhs or error
        // 3) lhs negative, rhs positive - check result <= lhs
        // 4) lhs negative, rhs negative - overflow not possible

        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs - (std::uint64_t)rhs);

        // Note - ideally, we can order these so that true conditionals
        // lead to success, which enables better pipelining
        // It isn't practical here
        if( ( lhs >= 0 && rhs < 0 && tmp < lhs ) || // condition 2
            ( rhs >= 0 && tmp > lhs ) )             // condition 3
        {
            return false;
        }

        result = (T)tmp;
        return true;
    }